

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Payload *v)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  if ((*(long *)(this + 8) == 0) && (((byte)this[0x108] & 1) == 0)) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"None",4);
  }
  else {
    ::std::operator<<(local_190,(AssetPath *)this);
    if (this[0x108] == (tinyusdz)0x1) {
      ::std::operator<<(local_190,(Path *)(this + 0x40));
    }
    ::std::operator<<(local_190,(LayerOffset *)(this + 0x110));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Payload &v) {
  std::stringstream ss;

  if (v.is_none()) {
    // pxrUSD serialize and prints 'None' for payload by filling all members in Payload empty.
    ss << "None";

  } else {
    ss << v.asset_path;
    if (v.prim_path.is_valid()) {
      ss << v.prim_path;
    }

    ss << v.layerOffset;
  }

  return ss.str();
}